

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall
Parser::createLocalVarDeclarationNode
          (Parser *this,Token *t,vector<Node_*,_std::allocator<Node_*>_> *var_keys,
          vector<Node_*,_std::allocator<Node_*>_> *optional_values)

{
  Node *pNVar1;
  size_type sVar2;
  CompilationContext *ctx_;
  reference ppNVar3;
  vector<Node_*,_std::allocator<Node_*>_> *in_RCX;
  vector<Node_*,_std::allocator<Node_*>_> *in_RDX;
  Node *declarator;
  size_t i;
  Node *n;
  Token *in_stack_ffffffffffffff70;
  CompilationContext *in_stack_ffffffffffffff78;
  Node *in_stack_ffffffffffffff80;
  CompilationContext *this_00;
  ulong local_40;
  
  pNVar1 = (Node *)operator_new(0x30);
  Node::Node(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  pNVar1->nodeType = PNT_LOCAL_VAR_DECLARATION;
  local_40 = 0;
  while( true ) {
    sVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::size(in_RDX);
    if (sVar2 <= local_40) break;
    ctx_ = (CompilationContext *)operator_new(0x30);
    this_00 = ctx_;
    std::vector<Node_*,_std::allocator<Node_*>_>::operator[](in_RDX,local_40);
    Node::Node((Node *)this_00,ctx_,in_stack_ffffffffffffff70);
    *(undefined4 *)
     &(ctx_->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0x1e;
    in_stack_ffffffffffffff70 = (Token *)&ctx_->poolableObjects;
    std::vector<Node_*,_std::allocator<Node_*>_>::operator[](in_RDX,local_40);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)this_00,(value_type *)ctx_);
    ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](in_RCX,local_40);
    if (*ppNVar3 != (value_type)0x0) {
      std::vector<Node_*,_std::allocator<Node_*>_>::operator[](in_RCX,local_40);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)this_00,(value_type *)ctx_);
    }
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)this_00,(value_type *)ctx_);
    local_40 = local_40 + 1;
  }
  return pNVar1;
}

Assistant:

Node * createLocalVarDeclarationNode(Token & t, vector<Node *> var_keys, vector<Node *> optional_values)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_LOCAL_VAR_DECLARATION;

    for (size_t i = 0; i < var_keys.size(); i++)
    {
      Node * declarator = new Node(ctx, var_keys[i]->tok);
      declarator->nodeType = PNT_VAR_DECLARATOR;
      declarator->children.push_back(var_keys[i]);
      if (optional_values[i])
        declarator->children.push_back(optional_values[i]);
      n->children.push_back(declarator);
    }

    return n;
  }